

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

int duckdb_lz4::LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int iVar1;
  LZ4_stream_t *dst;
  int in_ECX;
  int in_R8D;
  int in_R9D;
  limitedOutput_directive unaff_retaddr;
  tableType_t in_stack_00000008;
  dict_directive in_stack_00000010;
  dictIssue_directive in_stack_00000018;
  int in_stack_00000020;
  tableType_t tableType_1;
  tableType_t tableType;
  LZ4_stream_t_internal *ctx;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 local_4;
  
  dst = LZ4_initStream((void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (in_R9D < 1) {
    in_R9D = 1;
  }
  if (0x10001 < in_R9D) {
    in_R9D = 0x10001;
  }
  iVar2 = in_R8D;
  iVar1 = LZ4_compressBound(in_ECX);
  if (in_R8D < iVar1) {
    if (in_ECX < 0x1000b) {
      local_4 = LZ4_compress_generic
                          ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar2),
                           (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),dst->minStateSize,
                           in_stack_ffffffffffffffc4,
                           (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8),
                           in_stack_ffffffffffffffb4,unaff_retaddr,in_stack_00000008,
                           in_stack_00000010,in_stack_00000018,in_stack_00000020);
    }
    else {
      local_4 = LZ4_compress_generic
                          ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar2),
                           (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),dst->minStateSize,
                           in_stack_ffffffffffffffc4,
                           (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8),
                           in_stack_ffffffffffffffb4,unaff_retaddr,in_stack_00000008,
                           in_stack_00000010,in_stack_00000018,in_stack_00000020);
    }
  }
  else if (in_ECX < 0x1000b) {
    local_4 = LZ4_compress_generic
                        ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar2),
                         (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),dst->minStateSize,
                         in_stack_ffffffffffffffc4,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8)
                         ,in_stack_ffffffffffffffb4,unaff_retaddr,in_stack_00000008,
                         in_stack_00000010,in_stack_00000018,in_stack_00000020);
  }
  else {
    local_4 = LZ4_compress_generic
                        ((LZ4_stream_t_internal *)CONCAT44(in_ECX,iVar2),
                         (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),dst->minStateSize,2,
                         (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb4
                         ,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                         in_stack_00000020);
  }
  return local_4;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}